

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImGuiColumnsSet *pIVar1;
  ImVector<ImGuiColumnData> *pIVar2;
  int *piVar3;
  ImRect *pIVar4;
  int iVar5;
  ImGuiWindow *this;
  ImGuiColumnData *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiID IVar9;
  ulong uVar10;
  ImGuiColumnsSet *pIVar11;
  long lVar12;
  ImGuiColumnData *pIVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ImGuiColumnsSet *unaff_R12;
  ImGuiColumnsSet *pIVar18;
  ImGuiContext *g;
  ulong uVar19;
  char *str;
  bool bVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImGuiColumnsSet local_70;
  
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (columns_count < 2) {
    __assert_fail("columns_count > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3253,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((this->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    __assert_fail("window->DC.ColumnsSet == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3254,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  iVar8 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar8 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar8);
  IVar9 = ImGuiWindow::GetID(this,str,(char *)0x0);
  PopID();
  uVar10 = (ulong)(this->ColumnsStorage).Size;
  bVar20 = 0 < (long)uVar10;
  if (0 < (long)uVar10) {
    unaff_R12 = (this->ColumnsStorage).Data;
    bVar20 = true;
    if (unaff_R12->ID != IVar9) {
      pIVar11 = unaff_R12 + (uVar10 - 1);
      uVar19 = 1;
      pIVar18 = unaff_R12;
      do {
        uVar17 = uVar19;
        unaff_R12 = pIVar11;
        if (uVar10 == uVar17) break;
        unaff_R12 = pIVar18 + 1;
        pIVar1 = pIVar18 + 1;
        uVar19 = uVar17 + 1;
        pIVar18 = unaff_R12;
      } while (pIVar1->ID != IVar9);
      bVar20 = uVar17 < uVar10;
    }
  }
  if (!bVar20) {
    ImGuiColumnsSet::ImGuiColumnsSet(&local_70);
    iVar8 = (this->ColumnsStorage).Size;
    iVar5 = (this->ColumnsStorage).Capacity;
    if (iVar8 == iVar5) {
      iVar8 = iVar8 + 1;
      if (iVar5 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar5 / 2 + iVar5;
      }
      if (iVar8 < iVar14) {
        iVar8 = iVar14;
      }
      if (iVar5 < iVar8) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pIVar11 = (ImGuiColumnsSet *)(*GImAllocatorAllocFunc)((long)iVar8 << 6,GImAllocatorUserData)
        ;
        pIVar18 = (this->ColumnsStorage).Data;
        if (pIVar18 != (ImGuiColumnsSet *)0x0) {
          memcpy(pIVar11,pIVar18,(long)(this->ColumnsStorage).Size << 6);
          pIVar18 = (this->ColumnsStorage).Data;
          if (pIVar18 != (ImGuiColumnsSet *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
        }
        (this->ColumnsStorage).Data = pIVar11;
        (this->ColumnsStorage).Capacity = iVar8;
      }
    }
    pIVar18 = (this->ColumnsStorage).Data;
    iVar8 = (this->ColumnsStorage).Size;
    pIVar2 = &pIVar18[iVar8].Columns;
    pIVar2->Size = local_70.Columns.Size;
    pIVar2->Capacity = local_70.Columns.Capacity;
    *(undefined4 *)&pIVar2->Data = local_70.Columns.Data._0_4_;
    *(undefined4 *)((long)&pIVar2->Data + 4) = local_70.Columns.Data._4_4_;
    pIVar11 = pIVar18 + iVar8;
    pIVar11->LineMaxY = local_70.LineMaxY;
    pIVar11->StartPosY = local_70.StartPosY;
    *(undefined8 *)(&pIVar11->LineMaxY + 2) = local_70._40_8_;
    piVar3 = &pIVar18[iVar8].Count;
    *piVar3 = local_70.Count;
    piVar3[1] = (int)local_70.MinX;
    piVar3[2] = (int)local_70.MaxX;
    piVar3[3] = (int)local_70.LineMinY;
    pIVar18 = pIVar18 + iVar8;
    pIVar18->ID = local_70.ID;
    pIVar18->Flags = local_70.Flags;
    pIVar18->IsFirstFrame = local_70.IsFirstFrame;
    pIVar18->IsBeingResized = local_70.IsBeingResized;
    *(undefined2 *)&pIVar18->field_0xa = local_70._10_2_;
    pIVar18->Current = local_70.Current;
    (this->ColumnsStorage).Size = (this->ColumnsStorage).Size + 1;
    if ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_) != (void *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)
                ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_),
                 GImAllocatorUserData);
    }
    lVar12 = (long)(this->ColumnsStorage).Size;
    if (lVar12 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4ca,"value_type &ImVector<ImGuiColumnsSet>::back() [T = ImGuiColumnsSet]");
    }
    unaff_R12 = (this->ColumnsStorage).Data + lVar12 + -1;
    unaff_R12->ID = IVar9;
  }
  if (unaff_R12->ID != IVar9) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x325e,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  unaff_R12->Current = 0;
  unaff_R12->Count = columns_count;
  unaff_R12->Flags = flags;
  (this->DC).ColumnsSet = unaff_R12;
  fVar24 = (this->SizeContentsExplicit).x;
  if ((fVar24 == 0.0) && (!NAN(fVar24))) {
    fVar24 = (this->InnerClipRect).Max.x - (this->Pos).x;
  }
  fVar22 = (this->DC).IndentX;
  fVar26 = fVar22 - (pIVar7->Style).ItemSpacing.x;
  unaff_R12->MinX = fVar26;
  fVar24 = fVar24 - (this->Scroll).x;
  fVar26 = fVar26 + 1.0;
  uVar21 = -(uint)(fVar26 <= fVar24);
  unaff_R12->MaxX = (float)(~uVar21 & (uint)fVar26 | (uint)fVar24 & uVar21);
  fVar24 = (this->DC).CursorPos.y;
  unaff_R12->StartPosY = fVar24;
  unaff_R12->StartMaxPosX = (this->DC).CursorMaxPos.x;
  unaff_R12->LineMaxY = fVar24;
  unaff_R12->LineMinY = fVar24;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar22 + (this->Pos).x + 0.0);
  uVar21 = (unaff_R12->Columns).Size;
  uVar16 = columns_count + 1;
  if (uVar21 != uVar16 && uVar21 != 0) {
    iVar8 = (unaff_R12->Columns).Capacity;
    if (iVar8 < 0) {
      uVar15 = iVar8 / 2 + iVar8;
      uVar21 = 0;
      if (0 < (int)uVar15) {
        uVar21 = uVar15;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar13 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((ulong)uVar21 * 0x1c,GImAllocatorUserData);
      pIVar6 = (unaff_R12->Columns).Data;
      if (pIVar6 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar13,pIVar6,(long)(unaff_R12->Columns).Size * 0x1c);
        pIVar6 = (unaff_R12->Columns).Data;
        if (pIVar6 != (ImGuiColumnData *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (unaff_R12->Columns).Data = pIVar13;
      (unaff_R12->Columns).Capacity = uVar21;
    }
    (unaff_R12->Columns).Size = 0;
  }
  bVar20 = (unaff_R12->Columns).Size == 0;
  unaff_R12->IsFirstFrame = bVar20;
  if (bVar20) {
    if ((unaff_R12->Columns).Capacity <= columns_count) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar13 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((ulong)uVar16 * 0x1c,GImAllocatorUserData);
      pIVar6 = (unaff_R12->Columns).Data;
      if (pIVar6 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar13,pIVar6,(long)(unaff_R12->Columns).Size * 0x1c);
        pIVar6 = (unaff_R12->Columns).Data;
        if (pIVar6 != (ImGuiColumnData *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (unaff_R12->Columns).Data = pIVar13;
      (unaff_R12->Columns).Capacity = uVar16;
    }
    uVar21 = 0;
    do {
      iVar8 = (unaff_R12->Columns).Size;
      iVar5 = (unaff_R12->Columns).Capacity;
      if (iVar8 == iVar5) {
        if (iVar5 == 0) {
          iVar14 = 8;
        }
        else {
          iVar14 = iVar5 / 2 + iVar5;
        }
        iVar8 = iVar8 + 1;
        if (iVar8 < iVar14) {
          iVar8 = iVar14;
        }
        if (iVar5 < iVar8) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
          pIVar13 = (ImGuiColumnData *)
                    (*GImAllocatorAllocFunc)((long)iVar8 * 0x1c,GImAllocatorUserData);
          pIVar6 = (unaff_R12->Columns).Data;
          if (pIVar6 != (ImGuiColumnData *)0x0) {
            memcpy(pIVar13,pIVar6,(long)(unaff_R12->Columns).Size * 0x1c);
            pIVar6 = (unaff_R12->Columns).Data;
            if (pIVar6 != (ImGuiColumnData *)0x0) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
            }
            (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
          }
          (unaff_R12->Columns).Data = pIVar13;
          (unaff_R12->Columns).Capacity = iVar8;
        }
      }
      pIVar6 = (unaff_R12->Columns).Data;
      iVar8 = (unaff_R12->Columns).Size;
      pIVar6[iVar8].OffsetNorm = (float)(int)uVar21 / (float)columns_count;
      pIVar6[iVar8].OffsetNormBeforeResize = 0.0;
      pIVar6[iVar8].Flags = 0;
      pIVar4 = &pIVar6[iVar8].ClipRect;
      (pIVar4->Min).x = 3.4028235e+38;
      (pIVar4->Min).y = 3.4028235e+38;
      (pIVar4->Max).x = -3.4028235e+38;
      (pIVar4->Max).y = -3.4028235e+38;
      (unaff_R12->Columns).Size = (unaff_R12->Columns).Size + 1;
      uVar21 = uVar21 + 1;
    } while (uVar16 != uVar21);
  }
  uVar10 = 1;
  if (1 < columns_count) {
    uVar10 = (ulong)(uint)columns_count;
  }
  lVar12 = 0xc;
  uVar19 = 0;
  do {
    if ((long)(unaff_R12->Columns).Size <= (long)uVar19) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c0,
                    "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar6 = (unaff_R12->Columns).Data;
    fVar24 = (this->Pos).x;
    fVar22 = GetColumnOffset((int)uVar19);
    fVar23 = (float)(int)(fVar22 + fVar24 + 0.5 + -1.0);
    fVar24 = (this->Pos).x;
    uVar19 = uVar19 + 1;
    fVar22 = GetColumnOffset((int)uVar19);
    fVar26 = (float)(int)(fVar22 + fVar24 + 0.5 + -1.0);
    *(float *)((long)&pIVar6->OffsetNorm + lVar12) = fVar23;
    *(undefined4 *)((long)&pIVar6->OffsetNormBeforeResize + lVar12) = 0xff7fffff;
    *(float *)((long)&pIVar6->Flags + lVar12) = fVar26;
    *(undefined4 *)((long)&(pIVar6->ClipRect).Min.x + lVar12) = 0x7f7fffff;
    fVar24 = (this->ClipRect).Min.x;
    uVar21 = -(uint)(fVar24 <= fVar23);
    fVar22 = (this->ClipRect).Min.y;
    fVar25 = -3.4028235e+38;
    if (-3.4028235e+38 <= fVar22) {
      fVar25 = fVar22;
    }
    *(ulong *)((long)&pIVar6->OffsetNorm + lVar12) =
         CONCAT44(fVar25,~uVar21 & (uint)fVar24 | (uint)fVar23 & uVar21);
    fVar24 = (this->ClipRect).Max.x;
    if (fVar24 <= fVar26) {
      fVar26 = fVar24;
    }
    fVar24 = (this->ClipRect).Max.y;
    fVar22 = 3.4028235e+38;
    if (fVar24 <= 3.4028235e+38) {
      fVar22 = fVar24;
    }
    *(ulong *)((long)&pIVar6->Flags + lVar12) = CONCAT44(fVar22,fVar26);
    lVar12 = lVar12 + 0x1c;
  } while (uVar10 != uVar19);
  ImDrawList::ChannelsSplit(this->DrawList,unaff_R12->Count);
  PushColumnClipRect(-1);
  fVar24 = GetColumnWidth(-1);
  PushItemWidth(fVar24 * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.IndentX - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}